

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_metric(REF_GRID ref_grid,char *filename)

{
  uint uVar1;
  int iVar2;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL met_format;
  REF_BOOL solb_format;
  size_t end_of_string;
  REF_NODE ref_node;
  FILE *file;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  end_of_string = (size_t)ref_grid->node;
  ref_private_macro_code_rss = 0;
  ref_private_macro_code_rss_1 = 0;
  file = (FILE *)filename;
  filename_local = (char *)ref_grid;
  uVar1 = ref_node_synchronize_globals((REF_NODE)end_of_string);
  if (uVar1 == 0) {
    ref_node = (REF_NODE)0x0;
    if (*(int *)(*(long *)filename_local + 4) == 0) {
      ref_node = (REF_NODE)fopen((char *)file,"w");
      if ((FILE *)ref_node == (FILE *)0x0) {
        printf("unable to open %s\n",file);
      }
      if (ref_node == (REF_NODE)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xbb2,"ref_gather_metric","unable to open file");
        return 2;
      }
      _met_format = strlen((char *)file);
      if ((5 < _met_format) &&
         (iVar2 = strcmp((char *)((long)file + (_met_format - 5)),".solb"), iVar2 == 0)) {
        ref_private_macro_code_rss = 1;
      }
      if ((4 < _met_format) &&
         (iVar2 = strcmp((char *)((long)file + (_met_format - 4)),".met"), iVar2 == 0)) {
        ref_private_macro_code_rss_1 = 1;
      }
    }
    uVar1 = ref_mpi_all_or(*(REF_MPI *)filename_local,&ref_private_macro_code_rss);
    if (uVar1 == 0) {
      uVar1 = ref_mpi_all_or(*(REF_MPI *)filename_local,&ref_private_macro_code_rss_1);
      if (uVar1 == 0) {
        if (ref_private_macro_code_rss == 0) {
          if (ref_private_macro_code_rss_1 == 0) {
            uVar1 = ref_gather_node_metric((REF_NODE)end_of_string,(FILE *)ref_node);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xbc2,"ref_gather_metric",(ulong)uVar1,"nodes");
              return uVar1;
            }
          }
          else {
            uVar1 = ref_gather_node_bamg_met((REF_GRID)filename_local,(FILE *)ref_node);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xbc0,"ref_gather_metric",(ulong)uVar1,"nodes");
              return uVar1;
            }
          }
        }
        else {
          uVar1 = ref_gather_node_metric_solb((REF_GRID)filename_local,(FILE *)ref_node);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xbbe,"ref_gather_metric",(ulong)uVar1,"nodes");
            return uVar1;
          }
        }
        if (*(int *)(*(long *)filename_local + 4) == 0) {
          fclose((FILE *)ref_node);
        }
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xbbb,"ref_gather_metric",(ulong)uVar1,"bcast");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xbba,"ref_gather_metric",(ulong)uVar1,"bcast");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0xbac,
           "ref_gather_metric",(ulong)uVar1,"sync");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_gather_metric(REF_GRID ref_grid, const char *filename) {
  FILE *file;
  REF_NODE ref_node = ref_grid_node(ref_grid);
  size_t end_of_string;
  REF_BOOL solb_format = REF_FALSE;
  REF_BOOL met_format = REF_FALSE;

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    end_of_string = strlen(filename);
    if (end_of_string > 5 && strcmp(&filename[end_of_string - 5], ".solb") == 0)
      solb_format = REF_TRUE;
    if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".met") == 0)
      met_format = REF_TRUE;
  }
  RSS(ref_mpi_all_or(ref_grid_mpi(ref_grid), &solb_format), "bcast");
  RSS(ref_mpi_all_or(ref_grid_mpi(ref_grid), &met_format), "bcast");

  if (solb_format) {
    RSS(ref_gather_node_metric_solb(ref_grid, file), "nodes");
  } else if (met_format) {
    RSS(ref_gather_node_bamg_met(ref_grid, file), "nodes");
  } else {
    RSS(ref_gather_node_metric(ref_node, file), "nodes");
  }

  if (ref_grid_once(ref_grid)) fclose(file);

  return REF_SUCCESS;
}